

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  int col;
  undefined4 uVar9;
  Vec4 *local_a0;
  ulong local_98;
  float local_90 [6];
  Vector<float,_3> res_1;
  undefined8 uStack_68;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in0;
  
  puVar2 = &uStack_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar7) = uVar9;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    uStack_68 = *(undefined8 *)evalCtx->in[0].m_data;
    res_2.m_data[0] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    res_2.m_data[1] = (float)uVar1;
    res_2.m_data[2] = (float)((ulong)uVar1 >> 0x20);
    in0.m_data.m_data[0].m_data[0] = (float)((ulong)*(undefined8 *)evalCtx->in[3].m_data >> 0x20);
    in0.m_data.m_data[0].m_data[1] = evalCtx->in[3].m_data[2];
  }
  else {
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    uStack_68 = 0;
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat4x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      puVar8 = puVar2;
      do {
        *(undefined4 *)puVar8 = puVar5[lVar6];
        lVar6 = lVar6 + 1;
        puVar8 = (undefined8 *)((long)puVar8 + 0xc);
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  pfVar3 = in0.m_data.m_data[0].m_data + 2;
  in0.m_data.m_data[3].m_data[1] = 0.0;
  in0.m_data.m_data[3].m_data[2] = 0.0;
  in0.m_data.m_data[2].m_data[0] = 0.0;
  in0.m_data.m_data[2].m_data[1] = 0.0;
  in0.m_data.m_data[2].m_data[2] = 0.0;
  in0.m_data.m_data[3].m_data[0] = 0.0;
  in0.m_data.m_data[0].m_data[2] = 0.0;
  in0.m_data.m_data[1].m_data[0] = 0.0;
  in0.m_data.m_data[1].m_data[1] = 0.0;
  in0.m_data.m_data[1].m_data[2] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar7) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar7) = uVar9;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x30);
    lVar6 = lVar6 + 1;
    pfVar3 = pfVar3 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar6 != 3);
  pfVar3 = in0.m_data.m_data[0].m_data + 2;
  puVar2 = &uStack_68;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(uint *)((long)pfVar3 + lVar6) = *(uint *)((long)puVar2 + lVar6) ^ 0x80000000;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
  } while (lVar4 != 3);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar4 = 0;
  do {
    res_1.m_data[lVar4] =
         in0.m_data.m_data[0].m_data[lVar4 + 2] + in0.m_data.m_data[1].m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_98 = local_98 & 0xffffffff00000000;
  local_a0 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_a0 + lVar4 * 4) =
         res_1.m_data[lVar4] + in0.m_data.m_data[2].m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_90[4] = 0.0;
  local_90[2] = 0.0;
  local_90[3] = 0.0;
  lVar4 = 0;
  do {
    local_90[lVar4 + 2] =
         *(float *)((long)&local_a0 + lVar4 * 4) + in0.m_data.m_data[3].m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a0 = &evalCtx->color;
  local_98 = 0x100000000;
  local_90[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a0 + lVar4 * 4)] = local_90[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}